

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O1

uint64_t __thiscall
mini_bus::
MiniBusPacketDecoder<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::read_varuint(MiniBusPacketDecoder<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
               *this)

{
  uint64_t uVar1;
  char ssize [1];
  char local_89;
  error_code local_88;
  int local_70;
  uint uStack_6c;
  error_category *peStack_68;
  char *local_60;
  undefined8 local_58;
  char **local_50 [2];
  error_code local_40;
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_60 = &local_89;
  local_50[0] = &local_60;
  local_58 = 1;
  local_70 = 0;
  uStack_6c = uStack_6c & 0xffffff00;
  peStack_68 = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  boost::asio::detail::
  read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t>
            (this->stream,local_50[0],(system_error *)local_50,&local_70);
  if ((char)uStack_6c != '\x01') {
    uVar1 = (uint64_t)local_89;
    if ((long)uVar1 < 0) {
      uVar1 = read_varuint(this);
      uVar1 = (ulong)((int)local_89 & 0x7f) | uVar1 << 7;
    }
    return uVar1;
  }
  local_88._4_4_ = uStack_6c;
  local_88.val_ = local_70;
  local_88.cat_ = peStack_68;
  std::runtime_error::runtime_error((runtime_error *)local_50,"read");
  local_50[0] = &PTR__system_error_0011eb10;
  local_40.val_ = local_88.val_;
  local_40.failed_ = local_88.failed_;
  local_40._5_3_ = local_88._5_3_;
  local_40.cat_ = local_88.cat_;
  local_30._M_p = (pointer)((long)&((system_error *)local_50)->m_what + 0x10);
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  boost::throw_exception<boost::system::system_error>((system_error *)local_50);
}

Assistant:

inline uint64_t read_varuint() {
    char ssize[1];
    details::read_exactly(stream, ssize);
    unsigned char size = (unsigned char) ssize[0];
    if (size < 128) return size;
    auto ret = ((int64_t) size & 0b01111111);
    ret += read_varuint() << 7;
    return ret;
  }